

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_defined_units.cpp
# Opt level: O1

void __thiscall
unitStringDefinitions_customaryVector_Test::TestBody
          (unitStringDefinitions_customaryVector_Test *this)

{
  long lVar1;
  pointer *__ptr;
  char *in_R9;
  long *plVar2;
  long lVar3;
  bool bVar4;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  string local_58;
  AssertHelper local_38;
  
  plVar2 = &units::defined_unit_strings_customary;
  lVar3 = 0;
  while( true ) {
    lVar1 = *plVar2;
    local_68[0] = (internal)(lVar1 != 0);
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_68[0]) {
      testing::Message::Message((Message *)&local_70);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_70._M_head_impl + 0x10));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_58,local_68,
                 (AssertionResult *)"units::defined_unit_strings_customary[ii].first != nullptr",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_defined_units.cpp"
                 ,0x1c,local_58._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (local_70._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_70._M_head_impl + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    if (lVar1 == 0) break;
    plVar2 = plVar2 + 3;
    bVar4 = lVar3 == 0x49c;
    lVar3 = lVar3 + 1;
    if (bVar4) {
      return;
    }
  }
  return;
}

Assistant:

TEST(unitStringDefinitions, customaryVector)
{
    for (std::size_t ii = 0; ii < units::defined_unit_strings_customary.size();
         ++ii) {
        EXPECT_TRUE(units::defined_unit_strings_customary[ii].first != nullptr)
            << ii;
        if (units::defined_unit_strings_customary[ii].first == nullptr) {
            break;
        }
    }
}